

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallbackTexture.cpp
# Opt level: O3

Texture __thiscall
Rml::CallbackTextureSource::GetTexture(CallbackTextureSource *this,RenderManager *render_manager)

{
  Texture TVar1;
  UniqueRenderResource<Rml::CallbackTexture,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
  *this_00;
  StableVectorIndex callback_index;
  undefined1 local_50 [16];
  function<bool_(const_Rml::CallbackTextureInterface_&)> local_40;
  
  local_50._0_8_ = render_manager;
  this_00 = &itlib::
             flat_map<Rml::RenderManager*,Rml::CallbackTexture,itlib::fmimpl::less,std::vector<std::pair<Rml::RenderManager*,Rml::CallbackTexture>,std::allocator<std::pair<Rml::RenderManager*,Rml::CallbackTexture>>>>
             ::operator[]<Rml::RenderManager*>
                       ((flat_map<Rml::RenderManager*,Rml::CallbackTexture,itlib::fmimpl::less,std::vector<std::pair<Rml::RenderManager*,Rml::CallbackTexture>,std::allocator<std::pair<Rml::RenderManager*,Rml::CallbackTexture>>>>
                         *)&this->textures,(RenderManager **)local_50)->
             super_UniqueRenderResource<Rml::CallbackTexture,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
  ;
  callback_index = this_00->resource_handle;
  if (callback_index == Invalid) {
    ::std::function<bool_(const_Rml::CallbackTextureInterface_&)>::function
              ((function<bool_(const_Rml::CallbackTextureInterface_&)> *)(local_50 + 0x10),
               &this->callback);
    RenderManager::MakeCallbackTexture
              ((RenderManager *)local_50,(CallbackTextureFunction *)render_manager);
    UniqueRenderResource<Rml::CallbackTexture,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
    ::operator=(this_00,(UniqueRenderResource<Rml::CallbackTexture,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                         *)local_50);
    UniqueRenderResource<Rml::CallbackTexture,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
    ::~UniqueRenderResource
              ((UniqueRenderResource<Rml::CallbackTexture,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                *)local_50);
    if (local_40.super__Function_base._M_manager != (code *)0x0) {
      (*local_40.super__Function_base._M_manager)
                ((_Any_data *)(local_50 + 0x10),(_Any_data *)(local_50 + 0x10),__destroy_functor);
    }
    callback_index = this_00->resource_handle;
  }
  Texture::Texture((Texture *)local_50,this_00->render_manager,callback_index);
  TVar1.file_index = local_50._8_4_;
  TVar1.callback_index = local_50._12_4_;
  TVar1.render_manager = (RenderManager *)local_50._0_8_;
  return TVar1;
}

Assistant:

Texture CallbackTextureSource::GetTexture(RenderManager& render_manager) const
{
	CallbackTexture& texture = textures[&render_manager];
	if (!texture)
		texture = render_manager.MakeCallbackTexture(callback);
	return Texture(texture);
}